

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buttons.cpp
# Opt level: O2

bool __thiscall GPIO::DigitalIn::debounce(DigitalIn *this)

{
  bool bVar1;
  long lVar2;
  byte bVar3;
  
  bVar1 = GPIOBase::int_read(this->m_pin);
  if (bVar1 == (bool)((this->m_pullupdown != UP ^ this->m_state) & 1U)) {
    if ((this->m_min_trigger_interval).__r == 0) {
      return true;
    }
    lVar2 = std::chrono::_V2::steady_clock::now();
    if ((this->m_min_trigger_interval).__r <= lVar2 - (this->m_last_triggered).__d.__r) {
      if ((this->m_min_hold_interval).__r < 1) {
        bVar3 = this->m_state;
      }
      else {
        std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>(&this->m_min_hold_interval);
        bVar1 = GPIOBase::int_read(this->m_pin);
        bVar3 = this->m_state;
        if (bVar1 != (bool)((this->m_pullupdown != UP ^ bVar3) & 1)) {
          return false;
        }
      }
      (this->m_last_triggered).__d.__r = lVar2;
      this->m_state = (bool)(bVar3 ^ 1);
      return true;
    }
  }
  return false;
}

Assistant:

bool DigitalIn::debounce()
{
    // check if the input has the expected state

    if (m_gpio.read(m_pin) != ((m_pullupdown != GPIO_PULL::UP) ? !m_state : m_state)) return false;
    
    // is this a truly perfect digital 0 1 input? Then do not debounce..

    if (m_min_trigger_interval.count() == 0) return true;
    
    auto now = std::chrono::steady_clock::now();
    if ((now - m_last_triggered) < m_min_trigger_interval) return false;

    if (m_min_hold_interval.count() > 0) {

        // sleep a wink

        std::this_thread::sleep_for(m_min_hold_interval);
    
        // and check if the pin is still triggered (pin is 0 if pulldown and switch closed, otherwise 1

        if (m_gpio.read(m_pin) != ((m_pullupdown != GPIO_PULL::UP) ? !m_state : m_state)) return false;
    }
    
    // finally assign this event as the last trigger

    m_last_triggered = now;
    
    // toggle state

    m_state = !m_state;
    
    // and return success

    return true;
}